

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void * __thiscall
google::protobuf::internal::ExtensionSet::MutableRawRepeatedField
          (ExtensionSet *this,int number,FieldType field_type,bool packed,FieldDescriptor *desc)

{
  bool bVar1;
  CppType CVar2;
  byte in_CL;
  byte in_DL;
  long *in_RDI;
  Extension *extension;
  size_t n;
  size_t n_7;
  size_t n_1;
  size_t n_2;
  size_t n_3;
  size_t n_5;
  size_t n_4;
  size_t n_6;
  size_t n_8;
  size_t n_9;
  Arena **in_stack_fffffffffffffac8;
  Arena **args;
  void *in_stack_fffffffffffffad0;
  Arena **ptr;
  type_info *in_stack_fffffffffffffad8;
  Arena *in_stack_fffffffffffffae0;
  Arena *this_00;
  size_t in_stack_fffffffffffffae8;
  Arena *n_00;
  ArenaImpl *in_stack_fffffffffffffaf0;
  Extension **in_stack_fffffffffffffaf8;
  FieldDescriptor *in_stack_fffffffffffffb00;
  undefined8 in_stack_fffffffffffffb08;
  ExtensionSet *in_stack_fffffffffffffb10;
  undefined8 *local_430;
  RepeatedField<int> *local_388;
  RepeatedField<int> *local_368;
  RepeatedField<long> *local_2d8;
  RepeatedField<unsigned_int> *local_278;
  RepeatedField<unsigned_long> *local_218;
  RepeatedField<float> *local_1b8;
  RepeatedField<double> *local_158;
  RepeatedField<bool> *local_f8;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_98;
  RepeatedPtrField<google::protobuf::MessageLite> *local_38;
  
  bVar1 = MaybeNewExtension(in_stack_fffffffffffffb10,
                            (int)((ulong)in_stack_fffffffffffffb08 >> 0x20),
                            in_stack_fffffffffffffb00,in_stack_fffffffffffffaf8);
  if (bVar1) {
    *(undefined1 *)((long)local_430 + 9) = 1;
    *(byte *)(local_430 + 1) = in_DL;
    *(byte *)((long)local_430 + 0xb) = in_CL & 1;
    CVar2 = WireFormatLite::FieldTypeToCppType((uint)in_DL);
    switch(CVar2) {
    case CPPTYPE_INT32:
      if (*in_RDI == 0) {
        local_388 = (RepeatedField<int> *)operator_new(0x10);
        RepeatedField<int>::RepeatedField(local_388);
      }
      else {
        AlignUpTo8(0x10);
        Arena::AllocHook(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                         (size_t)in_stack_fffffffffffffad0);
        ArenaImpl::AllocateAlignedAndAddCleanup
                  (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                   (_func_void_void_ptr *)in_stack_fffffffffffffae0);
        local_388 = Arena::InternalHelper<google::protobuf::RepeatedField<int>>::
                    Construct<google::protobuf::Arena*>
                              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
      }
      *local_430 = local_388;
      break;
    case CPPTYPE_INT64:
      if (*in_RDI == 0) {
        local_2d8 = (RepeatedField<long> *)operator_new(0x10);
        RepeatedField<long>::RepeatedField(local_2d8);
      }
      else {
        AlignUpTo8(0x10);
        Arena::AllocHook(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                         (size_t)in_stack_fffffffffffffad0);
        ArenaImpl::AllocateAlignedAndAddCleanup
                  (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                   (_func_void_void_ptr *)in_stack_fffffffffffffae0);
        local_2d8 = Arena::InternalHelper<google::protobuf::RepeatedField<long>>::
                    Construct<google::protobuf::Arena*>
                              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
      }
      *local_430 = local_2d8;
      break;
    case CPPTYPE_UINT32:
      if (*in_RDI == 0) {
        local_278 = (RepeatedField<unsigned_int> *)operator_new(0x10);
        RepeatedField<unsigned_int>::RepeatedField(local_278);
      }
      else {
        AlignUpTo8(0x10);
        Arena::AllocHook(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                         (size_t)in_stack_fffffffffffffad0);
        ArenaImpl::AllocateAlignedAndAddCleanup
                  (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                   (_func_void_void_ptr *)in_stack_fffffffffffffae0);
        local_278 = Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_int>>::
                    Construct<google::protobuf::Arena*>
                              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
      }
      *local_430 = local_278;
      break;
    case CPPTYPE_UINT64:
      if (*in_RDI == 0) {
        local_218 = (RepeatedField<unsigned_long> *)operator_new(0x10);
        RepeatedField<unsigned_long>::RepeatedField(local_218);
      }
      else {
        AlignUpTo8(0x10);
        Arena::AllocHook(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                         (size_t)in_stack_fffffffffffffad0);
        ArenaImpl::AllocateAlignedAndAddCleanup
                  (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                   (_func_void_void_ptr *)in_stack_fffffffffffffae0);
        local_218 = Arena::InternalHelper<google::protobuf::RepeatedField<unsigned_long>>::
                    Construct<google::protobuf::Arena*>
                              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
      }
      *local_430 = local_218;
      break;
    case CPPTYPE_DOUBLE:
      if (*in_RDI == 0) {
        local_158 = (RepeatedField<double> *)operator_new(0x10);
        RepeatedField<double>::RepeatedField(local_158);
      }
      else {
        AlignUpTo8(0x10);
        Arena::AllocHook(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                         (size_t)in_stack_fffffffffffffad0);
        ArenaImpl::AllocateAlignedAndAddCleanup
                  (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                   (_func_void_void_ptr *)in_stack_fffffffffffffae0);
        local_158 = Arena::InternalHelper<google::protobuf::RepeatedField<double>>::
                    Construct<google::protobuf::Arena*>
                              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
      }
      *local_430 = local_158;
      break;
    case CPPTYPE_FLOAT:
      if (*in_RDI == 0) {
        local_1b8 = (RepeatedField<float> *)operator_new(0x10);
        RepeatedField<float>::RepeatedField(local_1b8);
      }
      else {
        AlignUpTo8(0x10);
        Arena::AllocHook(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                         (size_t)in_stack_fffffffffffffad0);
        ArenaImpl::AllocateAlignedAndAddCleanup
                  (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                   (_func_void_void_ptr *)in_stack_fffffffffffffae0);
        local_1b8 = Arena::InternalHelper<google::protobuf::RepeatedField<float>>::
                    Construct<google::protobuf::Arena*>
                              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
      }
      *local_430 = local_1b8;
      break;
    case CPPTYPE_BOOL:
      if (*in_RDI == 0) {
        local_f8 = (RepeatedField<bool> *)operator_new(0x10);
        RepeatedField<bool>::RepeatedField(local_f8);
      }
      else {
        AlignUpTo8(0x10);
        Arena::AllocHook(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                         (size_t)in_stack_fffffffffffffad0);
        ArenaImpl::AllocateAlignedAndAddCleanup
                  (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                   (_func_void_void_ptr *)in_stack_fffffffffffffae0);
        local_f8 = Arena::InternalHelper<google::protobuf::RepeatedField<bool>>::
                   Construct<google::protobuf::Arena*>
                             (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
      }
      *local_430 = local_f8;
      break;
    case CPPTYPE_ENUM:
      if (*in_RDI == 0) {
        local_368 = (RepeatedField<int> *)operator_new(0x10);
        RepeatedField<int>::RepeatedField(local_368);
      }
      else {
        AlignUpTo8(0x10);
        Arena::AllocHook(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,
                         (size_t)in_stack_fffffffffffffad0);
        ArenaImpl::AllocateAlignedAndAddCleanup
                  (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                   (_func_void_void_ptr *)in_stack_fffffffffffffae0);
        local_368 = Arena::InternalHelper<google::protobuf::RepeatedField<int>>::
                    Construct<google::protobuf::Arena*>
                              (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
      }
      *local_430 = local_368;
      break;
    case CPPTYPE_STRING:
      this_00 = (Arena *)*in_RDI;
      if (this_00 == (Arena *)0x0) {
        local_98 = (RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)operator_new(0x18);
        RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::RepeatedPtrField((RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)0x48d115);
      }
      else {
        n_00 = this_00;
        AlignUpTo8(0x18);
        Arena::AllocHook(this_00,in_stack_fffffffffffffad8,(size_t)in_stack_fffffffffffffad0);
        ArenaImpl::AllocateAlignedAndAddCleanup
                  (in_stack_fffffffffffffaf0,(size_t)n_00,(_func_void_void_ptr *)this_00);
        local_98 = Arena::InternalHelper<google::protobuf::RepeatedPtrField<std::__cxx11::string>>::
                   Construct<google::protobuf::Arena*>
                             (in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
      }
      *local_430 = local_98;
      break;
    case CPPTYPE_MESSAGE:
      args = (Arena **)*in_RDI;
      if (args == (Arena **)0x0) {
        local_38 = (RepeatedPtrField<google::protobuf::MessageLite> *)operator_new(0x18);
        RepeatedPtrField<google::protobuf::MessageLite>::RepeatedPtrField
                  ((RepeatedPtrField<google::protobuf::MessageLite> *)0x48d2b2);
      }
      else {
        ptr = args;
        AlignUpTo8(0x18);
        Arena::AllocHook(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,(size_t)ptr);
        ArenaImpl::AllocateAlignedAndAddCleanup
                  (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                   (_func_void_void_ptr *)in_stack_fffffffffffffae0);
        local_38 = Arena::
                   InternalHelper<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                   ::Construct<google::protobuf::Arena*>(ptr,args);
      }
      *local_430 = local_38;
    }
  }
  return (void *)*local_430;
}

Assistant:

void* ExtensionSet::MutableRawRepeatedField(int number, FieldType field_type,
                                            bool packed,
                                            const FieldDescriptor* desc) {
  Extension* extension;

  // We instantiate an empty Repeated{,Ptr}Field if one doesn't exist for this
  // extension.
  if (MaybeNewExtension(number, desc, &extension)) {
    extension->is_repeated = true;
    extension->type = field_type;
    extension->is_packed = packed;

    switch (WireFormatLite::FieldTypeToCppType(
        static_cast<WireFormatLite::FieldType>(field_type))) {
      case WireFormatLite::CPPTYPE_INT32:
        extension->repeated_int32_value =
            Arena::CreateMessage<RepeatedField<int32>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_INT64:
        extension->repeated_int64_value =
            Arena::CreateMessage<RepeatedField<int64>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_UINT32:
        extension->repeated_uint32_value =
            Arena::CreateMessage<RepeatedField<uint32>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_UINT64:
        extension->repeated_uint64_value =
            Arena::CreateMessage<RepeatedField<uint64>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_DOUBLE:
        extension->repeated_double_value =
            Arena::CreateMessage<RepeatedField<double>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_FLOAT:
        extension->repeated_float_value =
            Arena::CreateMessage<RepeatedField<float>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_BOOL:
        extension->repeated_bool_value =
            Arena::CreateMessage<RepeatedField<bool>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_ENUM:
        extension->repeated_enum_value =
            Arena::CreateMessage<RepeatedField<int>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_STRING:
        extension->repeated_string_value =
            Arena::CreateMessage<RepeatedPtrField<std::string>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_MESSAGE:
        extension->repeated_message_value =
            Arena::CreateMessage<RepeatedPtrField<MessageLite>>(arena_);
        break;
    }
  }

  // We assume that all the RepeatedField<>* pointers have the same
  // size and alignment within the anonymous union in Extension.
  return extension->repeated_int32_value;
}